

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O0

connectbundle * Curl_conncache_find_bundle(connectdata *conn,conncache *connc)

{
  char *__s;
  size_t key_len;
  char *key;
  connectbundle *bundle;
  conncache *connc_local;
  connectdata *conn_local;
  
  key = (char *)0x0;
  if ((connc != (conncache *)0x0) && (__s = hashkey(conn), __s != (char *)0x0)) {
    key_len = strlen(__s);
    key = (char *)Curl_hash_pick(&connc->hash,__s,key_len);
    (*Curl_cfree)(__s);
  }
  return (connectbundle *)key;
}

Assistant:

struct connectbundle *Curl_conncache_find_bundle(struct connectdata *conn,
                                                 struct conncache *connc)
{
  struct connectbundle *bundle = NULL;
  if(connc) {
    char *key = hashkey(conn);
    if(key) {
      bundle = Curl_hash_pick(&connc->hash, key, strlen(key));
      free(key);
    }
  }

  return bundle;
}